

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_XMLNode * __thiscall ON_XMLNode::operator=(ON_XMLNode *this,ON_XMLNode *src)

{
  ON_XMLNode *this_00;
  undefined1 local_70 [8];
  ChildIterator ci;
  ON_XMLNode *pChild;
  PropertyIterator pi;
  ON_XMLProperty *pProperty;
  lock_guard<std::recursive_mutex> local_30;
  lock_guard<std::recursive_mutex> lg2;
  lock_guard<std::recursive_mutex> lg1;
  ON_XMLNode *src_local;
  ON_XMLNode *this_local;
  
  if (this != src) {
    std::lock_guard<std::recursive_mutex>::lock_guard(&lg2,&this->_private->m_mutex);
    std::lock_guard<std::recursive_mutex>::lock_guard(&local_30,&src->_private->m_mutex);
    ON_XMLNodePrivate::RemoveAllProperties(this->_private);
    ON_XMLNodePrivate::RemoveAllChildren(this->_private);
    ON_wString::operator=(&this->_private->m_name,&src->_private->m_name);
    pi._private = (ON_XMLNodePropertyIteratorPrivate *)0x0;
    (*src->_vptr_ON_XMLNode[0x2d])(&pChild,src,0);
    while (pi._private = (ON_XMLNodePropertyIteratorPrivate *)
                         PropertyIterator::GetNextProperty((PropertyIterator *)&pChild),
          (ON_XMLProperty *)pi._private != (ON_XMLProperty *)0x0) {
      ON_XMLNodePrivate::AddProperty(this->_private,(ON_XMLProperty *)pi._private,true);
    }
    ci._private = (ON_XMLNodeChildIteratorPrivate *)0x0;
    (*src->_vptr_ON_XMLNode[0x2c])(local_70);
    while (ci._private = (ON_XMLNodeChildIteratorPrivate *)
                         ChildIterator::GetNextChild((ChildIterator *)local_70),
          (ON_XMLNode *)ci._private != (ON_XMLNode *)0x0) {
      this_00 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode(this_00,(ON_XMLNode *)ci._private);
      (*this->_vptr_ON_XMLNode[0xb])(this,this_00);
    }
    ChildIterator::~ChildIterator((ChildIterator *)local_70);
    PropertyIterator::~PropertyIterator((PropertyIterator *)&pChild);
    std::lock_guard<std::recursive_mutex>::~lock_guard(&local_30);
    std::lock_guard<std::recursive_mutex>::~lock_guard(&lg2);
  }
  return this;
}

Assistant:

const ON_XMLNode& ON_XMLNode::operator = (const ON_XMLNode& src)
{
  if (this == &src)
    return *this;

  std::lock_guard<std::recursive_mutex> lg1(_private->m_mutex);
  std::lock_guard<std::recursive_mutex> lg2(src._private->m_mutex);

  _private->RemoveAllProperties();
  _private->RemoveAllChildren();

  _private->m_name = src._private->m_name;

  // Copy in the properties.
  ON_XMLProperty* pProperty = nullptr;
  auto pi = src.GetPropertyIterator();
  while (nullptr != (pProperty = pi.GetNextProperty()))
  {
    _private->AddProperty(*pProperty, true);  //Add it to the end so that the order stays the same.
  }

  // Copy in the children.
  ON_XMLNode* pChild = nullptr;
  auto ci = src.GetChildIterator();
  while (nullptr != (pChild = ci.GetNextChild()))
  {
    AttachChildNode(new ON_XMLNode(*pChild));
  }

  return *this;
}